

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::NodeLoader::end__instance_controller(NodeLoader *this)

{
  long in_RDI;
  Array<COLLADAFW::MaterialBinding> *in_stack_00000008;
  
  COLLADAFW::InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431>::getMaterialBindings
            (*(InstanceBindingBase<(COLLADAFW::COLLADA_TYPE::ClassId)431> **)(in_RDI + 0x68));
  IFilePartLoader::
  copyStlContainerToArray<std::set<COLLADAFW::MaterialBinding,std::less<COLLADAFW::MaterialBinding>,std::allocator<COLLADAFW::MaterialBinding>>,COLLADAFW::Array<COLLADAFW::MaterialBinding>>
            ((set<COLLADAFW::MaterialBinding,_std::less<COLLADAFW::MaterialBinding>,_std::allocator<COLLADAFW::MaterialBinding>_>
              *)this,in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  endInstanceWithMaterial((NodeLoader *)0xc44023);
  return true;
}

Assistant:

bool NodeLoader::end__instance_controller()
	{
        FilePartLoader::copyStlContainerToArray( mCurrentMaterialBindings, mCurrentInstanceController->getMaterialBindings());
        mCurrentInstanceController = 0;
		mCurrentInstanceControllerData = 0;
        endInstanceWithMaterial();

		return true;
	}